

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

tjscalingfactor * tjGetScalingFactors(int *numscalingfactors)

{
  long in_FS_OFFSET;
  
  if (numscalingfactors != (int *)0x0) {
    *numscalingfactors = 0x10;
    return sf;
  }
  builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),"ors(): I",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"nvalid a",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjGetSca",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -200),"lingFact",8);
  *(undefined8 *)(in_FS_OFFSET + -0xb0) = 0x746e656d756772;
  return (tjscalingfactor *)0x0;
}

Assistant:

DLLEXPORT tjscalingfactor *tjGetScalingFactors(int *numscalingfactors)
{
  if (numscalingfactors == NULL) {
    snprintf(errStr, JMSG_LENGTH_MAX,
             "tjGetScalingFactors(): Invalid argument");
    return NULL;
  }

  *numscalingfactors = NUMSF;
  return (tjscalingfactor *)sf;
}